

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::AttrHelper_Vec2DArrToString
          (X3DExporter *this,aiVector2D *pArray,size_t pArray_Size,string *pTargetString)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  size_type sVar8;
  string *__range2;
  ulong uVar9;
  undefined8 uVar10;
  size_t sVar11;
  undefined8 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)pTargetString);
  local_58 = pArray_Size;
  if (pArray_Size != 0) {
    sVar11 = 0;
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",SUB84((double)pArray[sVar11].x,0));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_88 = *puVar6;
        lStack_80 = plVar4[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *puVar6;
        local_98 = (ulong *)*plVar4;
      }
      local_90 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_b8,vsnprintf,0x3a,"%f",SUB84((double)pArray[sVar11].y,0));
      uVar9 = 0xf;
      if (local_98 != &local_88) {
        uVar9 = local_88;
      }
      if (uVar9 < local_b8._M_string_length + local_90) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          uVar10 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_b8._M_string_length + local_90) goto LAB_006d0287;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
      }
      else {
LAB_006d0287:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8._M_dataplus._M_p)
        ;
      }
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_c8 = *puVar1;
        uStack_c0 = puVar5[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *puVar1;
        local_d8 = (undefined8 *)*puVar5;
      }
      local_d0 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_78 = &local_68;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_68 = *plVar7;
        lStack_60 = plVar4[3];
      }
      else {
        local_68 = *plVar7;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)pTargetString,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      sVar11 = sVar11 + 1;
    } while (local_58 != sVar11);
  }
  std::__cxx11::string::resize((ulong)pTargetString,(char)pTargetString->_M_string_length + -1);
  sVar2 = pTargetString->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (pTargetString->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      if (pcVar3[sVar8] == ',') {
        pcVar3[sVar8] = '.';
      }
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Vec2DArrToString(const aiVector2D* pArray, const size_t pArray_Size, std::string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 4);// (Number + space) * 2.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].x) + " " + to_string(pArray[idx].y) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}